

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x11_window.c
# Opt level: O1

void handleSelectionClear(XEvent *event)

{
  ulong uVar1;
  
  uVar1 = (ulong)((event->xkey).root != _glfw.x11.PRIMARY);
  _glfw_free(*(void **)((long)_glfw.x11.keynames + uVar1 * 8 + -0x10));
  *(undefined8 *)((long)_glfw.x11.keynames + uVar1 * 8 + -0x10) = 0;
  return;
}

Assistant:

static void handleSelectionClear(XEvent* event)
{
    if (event->xselectionclear.selection == _glfw.x11.PRIMARY)
    {
        _glfw_free(_glfw.x11.primarySelectionString);
        _glfw.x11.primarySelectionString = NULL;
    }
    else
    {
        _glfw_free(_glfw.x11.clipboardString);
        _glfw.x11.clipboardString = NULL;
    }
}